

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_schemas.cpp
# Opt level: O1

void duckdb::DuckDBSchemasFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  SchemaCatalogEntry *pSVar2;
  pointer pcVar3;
  reference pvVar4;
  long lVar5;
  string *psVar6;
  idx_t iVar7;
  _func_int **__n;
  ulong index;
  bool bVar8;
  string local_c8;
  string local_a8;
  Value local_88;
  LogicalType local_48;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  if (pGVar1[4]._vptr_GlobalTableFunctionState <
      (_func_int **)
      ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
       (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3)) {
    __n = pGVar1[4]._vptr_GlobalTableFunctionState;
    if (__n < (_func_int **)
              ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
               (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3)) {
      index = 0;
      do {
        pvVar4 = vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true>::operator[]
                           ((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *)
                            (pGVar1 + 1),(size_type)__n);
        pSVar2 = pvVar4->_M_data;
        lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                          ((pSVar2->super_InCatalogEntry).super_CatalogEntry.oid);
        Value::BIGINT(&local_88,lVar5);
        DataChunk::SetValue(output,0,index,&local_88);
        Value::~Value(&local_88);
        psVar6 = Catalog::GetName_abi_cxx11_((pSVar2->super_InCatalogEntry).catalog);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        pcVar3 = (psVar6->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar3,pcVar3 + psVar6->_M_string_length);
        Value::Value(&local_88,&local_a8);
        DataChunk::SetValue(output,1,index,&local_88);
        Value::~Value(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        iVar7 = Catalog::GetOid((pSVar2->super_InCatalogEntry).catalog);
        lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar7);
        Value::BIGINT(&local_88,lVar5);
        DataChunk::SetValue(output,2,index,&local_88);
        Value::~Value(&local_88);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        pcVar3 = (pSVar2->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar3,
                   pcVar3 + (pSVar2->super_InCatalogEntry).super_CatalogEntry.name._M_string_length)
        ;
        Value::Value(&local_88,&local_c8);
        DataChunk::SetValue(output,3,index,&local_88);
        Value::~Value(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        Value::Value(&local_88,&(pSVar2->super_InCatalogEntry).super_CatalogEntry.comment);
        DataChunk::SetValue(output,4,index,&local_88);
        Value::~Value(&local_88);
        Value::MAP(&local_88,&(pSVar2->super_InCatalogEntry).super_CatalogEntry.tags);
        DataChunk::SetValue(output,5,index,&local_88);
        Value::~Value(&local_88);
        Value::BOOLEAN(&local_88,(pSVar2->super_InCatalogEntry).super_CatalogEntry.internal);
        DataChunk::SetValue(output,6,index,&local_88);
        Value::~Value(&local_88);
        LogicalType::LogicalType(&local_48,SQLNULL);
        Value::Value(&local_88,&local_48);
        DataChunk::SetValue(output,7,index,&local_88);
        Value::~Value(&local_88);
        LogicalType::~LogicalType(&local_48);
        __n = (_func_int **)((long)pGVar1[4]._vptr_GlobalTableFunctionState + 1);
        pGVar1[4]._vptr_GlobalTableFunctionState = __n;
        iVar7 = index + 1;
      } while ((__n < (_func_int **)
                      ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
                       (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3)) &&
              (bVar8 = index < 0x7ff, index = iVar7, bVar8));
    }
    else {
      iVar7 = 0;
    }
    output->count = iVar7;
  }
  return;
}

Assistant:

void DuckDBSchemasFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBSchemasData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset].get();

		// return values:
		idx_t col = 0;
		// "oid", PhysicalType::BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.oid)));
		// database_name, VARCHAR
		output.SetValue(col++, count, entry.catalog.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.catalog.GetOid())));
		// "schema_name", PhysicalType::VARCHAR
		output.SetValue(col++, count, Value(entry.name));
		// "comment", PhysicalType::VARCHAR
		output.SetValue(col++, count, Value(entry.comment));
		// "tags", MAP(VARCHAR, VARCHAR)
		output.SetValue(col++, count, Value::MAP(entry.tags));
		// "internal", PhysicalType::BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(entry.internal));
		// "sql", PhysicalType::VARCHAR
		output.SetValue(col++, count, Value());

		data.offset++;
		count++;
	}
	output.SetCardinality(count);
}